

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O0

Vec_Ptr_t *
Llb_CoreConstructAll(Aig_Man_t *p,Vec_Ptr_t *vResult,Vec_Int_t *vVarsNs,abctime TimeTarget)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *vLower_00;
  DdManager *table;
  int local_54;
  Vec_Ptr_t *pVStack_50;
  int i;
  Vec_Ptr_t *vUpper;
  Vec_Ptr_t *vLower;
  Vec_Ptr_t *vDdMans;
  DdManager *dd;
  abctime TimeTarget_local;
  Vec_Int_t *vVarsNs_local;
  Vec_Ptr_t *vResult_local;
  Aig_Man_t *p_local;
  
  pVStack_50 = (Vec_Ptr_t *)0x0;
  iVar1 = Vec_PtrSize(vResult);
  p_00 = Vec_PtrStart(iVar1);
  local_54 = Vec_PtrSize(vResult);
  while( true ) {
    local_54 = local_54 + -1;
    if (local_54 < 0) {
      return p_00;
    }
    vLower_00 = (Vec_Ptr_t *)Vec_PtrEntry(vResult,local_54);
    iVar1 = Vec_PtrSize(vResult);
    if (local_54 < iVar1 + -1) {
      vDdMans = (Vec_Ptr_t *)Llb_ImgPartition(p,vLower_00,pVStack_50,TimeTarget);
    }
    else {
      vDdMans = (Vec_Ptr_t *)Llb_DriverLastPartition(p,vVarsNs,TimeTarget);
    }
    if (vDdMans == (Vec_Ptr_t *)0x0) break;
    Vec_PtrWriteEntry(p_00,local_54,vDdMans);
    pVStack_50 = vLower_00;
  }
  for (local_54 = 0; iVar1 = Vec_PtrSize(p_00), local_54 < iVar1; local_54 = local_54 + 1) {
    table = (DdManager *)Vec_PtrEntry(p_00,local_54);
    if (table != (DdManager *)0x0) {
      if (table->bFunc != (DdNode *)0x0) {
        Cudd_RecursiveDeref(table,table->bFunc);
      }
      Extra_StopManager(table);
    }
  }
  Vec_PtrFree(p_00);
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t * Llb_CoreConstructAll( Aig_Man_t * p, Vec_Ptr_t * vResult, Vec_Int_t * vVarsNs, abctime TimeTarget )
{
    DdManager * dd;
    Vec_Ptr_t * vDdMans;
    Vec_Ptr_t * vLower, * vUpper = NULL;
    int i;
    vDdMans = Vec_PtrStart( Vec_PtrSize(vResult) );
    Vec_PtrForEachEntryReverse( Vec_Ptr_t *, vResult, vLower, i )
    {
        if ( i < Vec_PtrSize(vResult) - 1 )
            dd = Llb_ImgPartition( p, vLower, vUpper, TimeTarget );
        else
            dd = Llb_DriverLastPartition( p, vVarsNs, TimeTarget );
        if ( dd == NULL )
        {
            Vec_PtrForEachEntry( DdManager *, vDdMans, dd, i )
            {
                if ( dd == NULL )
                    continue;
                if ( dd->bFunc )
                    Cudd_RecursiveDeref( dd, dd->bFunc );
                Extra_StopManager( dd );
            }
            Vec_PtrFree( vDdMans );
            return NULL;
        }
        Vec_PtrWriteEntry( vDdMans, i, dd );
        vUpper = vLower;
    }
    return vDdMans;
}